

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O3

uint qt_gradient_pixel_fixed(QGradientData *data,int fixed_pos)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = fixed_pos + 0x80 >> 8;
  uVar2 = uVar1;
  if (0x3ff < uVar1) {
    if (data->spread == ReflectSpread) {
      uVar2 = uVar1 & 0x7ff;
      if (0x3ff < uVar2) {
        uVar2 = uVar2 ^ 0x7ff;
      }
    }
    else if (data->spread == RepeatSpread) {
      uVar2 = uVar1 & 0x3ff;
    }
    else {
      uVar2 = 0x3ff;
      if ((int)uVar1 < 0) {
        uVar2 = 0;
      }
    }
  }
  return data->colorTable32[uVar2];
}

Assistant:

static uint qt_gradient_pixel_fixed(const QGradientData *data, int fixed_pos)
{
    int ipos = (fixed_pos + (FIXPT_SIZE / 2)) >> FIXPT_BITS;
    return data->colorTable32[qt_gradient_clamp(data, ipos)];
}